

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

void duckdb::TrimPathFunction<false>(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  unsigned_long *puVar1;
  long lVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  long *plVar4;
  reference this;
  idx_t iVar5;
  ValidityMask *this_00;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  data_ptr_t pdVar9;
  string_t sVar10;
  anon_struct_16_3_d7536bce_for_pointer aVar11;
  string_t a;
  string_t b;
  string_t b_00;
  ValidityMask *in_stack_fffffffffffffde8;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat local_1a0;
  UnifiedVectorFormat bdata;
  Vector trim_extension;
  Vector separator;
  anon_union_16_2_67f50693_for_value local_40;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  string_t::string_t((string_t *)&local_40.pointer,"default");
  Value::Value((Value *)&trim_extension,(string_t)local_40);
  Vector::Vector(&separator,(Value *)&trim_extension);
  Value::~Value((Value *)&trim_extension);
  Value::BOOLEAN((Value *)&adata,false);
  Vector::Vector(&trim_extension,(Value *)&adata);
  Value::~Value((Value *)&adata);
  adata.sel._0_1_ = 0;
  ReadOptionalArgs(args,&separator,&trim_extension,(bool *)&adata);
  count = args->count;
  if (((this->vector_type == CONSTANT_VECTOR) && (separator.vector_type == CONSTANT_VECTOR)) &&
     (trim_extension.vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
        ((separator.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 ||
         ((*separator.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)))
        ) && ((trim_extension.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((*trim_extension.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask &
               1) != 0)))) {
      paVar3 = (anon_union_16_2_67f50693_for_value *)result->data;
      aVar11 = (anon_struct_16_3_d7536bce_for_pointer)
               TernaryLambdaWrapper::
               Operation<duckdb::TrimPathFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)this->data)->pointer,
                          *(anon_union_16_2_67f50693_for_value *)separator.data,
                          (bool)*trim_extension.data,in_stack_fffffffffffffde8,(idx_t)result);
      paVar3->pointer = aVar11;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_1a0);
    Vector::ToUnifiedFormat(this,count,&adata);
    Vector::ToUnifiedFormat(&separator,count,&bdata);
    Vector::ToUnifiedFormat(&trim_extension,count,&local_1a0);
    plVar4 = (long *)CONCAT71(adata.sel._1_7_,adata.sel._0_1_);
    pdVar9 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      pdVar9 = pdVar9 + 8;
      for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
        lVar2 = *plVar4;
        iVar5 = iVar8;
        if (lVar2 != 0) {
          iVar5 = (idx_t)*(uint *)(lVar2 + iVar8 * 4);
        }
        iVar6 = iVar8;
        if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(bdata.sel)->sel_vector[iVar8];
        }
        iVar7 = iVar8;
        if ((local_1a0.sel)->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)(local_1a0.sel)->sel_vector[iVar8];
        }
        a.value.pointer.ptr = (char *)*(undefined8 *)(adata.data + iVar5 * 0x10 + 8);
        a.value._0_8_ = *(undefined8 *)(adata.data + iVar5 * 0x10);
        b.value.pointer.ptr = (char *)*(undefined8 *)(bdata.data + iVar6 * 0x10 + 8);
        b.value._0_8_ = *(undefined8 *)(bdata.data + iVar6 * 0x10);
        sVar10 = TernaryLambdaWrapper::
                 Operation<duckdb::TrimPathFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                           ((anon_class_8_1_6971b95b)result,a,b,(bool)local_1a0.data[iVar7],
                            in_stack_fffffffffffffde8,(idx_t)result);
        *(long *)(pdVar9 + -8) = sVar10.value._0_8_;
        *(long *)pdVar9 = sVar10.value._8_8_;
        pdVar9 = pdVar9 + 0x10;
      }
    }
    else {
      this_00 = &result->validity;
      pdVar9 = pdVar9 + 8;
      for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
        lVar2 = *plVar4;
        iVar5 = iVar8;
        if (lVar2 != 0) {
          iVar5 = (idx_t)*(uint *)(lVar2 + iVar8 * 4);
        }
        iVar6 = iVar8;
        if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(bdata.sel)->sel_vector[iVar8];
        }
        iVar7 = iVar8;
        if ((local_1a0.sel)->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)(local_1a0.sel)->sel_vector[iVar8];
        }
        if (((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6] >>
              (iVar5 & 0x3f) & 1) != 0)) &&
           (((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar6 >> 6]
               >> (iVar6 & 0x3f) & 1) != 0)) &&
            ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_1a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)))))) {
          sVar10.value.pointer.ptr = (char *)*(undefined8 *)(adata.data + iVar5 * 0x10 + 8);
          sVar10.value._0_8_ = *(undefined8 *)(adata.data + iVar5 * 0x10);
          b_00.value.pointer.ptr = (char *)*(undefined8 *)(bdata.data + iVar6 * 0x10 + 8);
          b_00.value._0_8_ = *(undefined8 *)(bdata.data + iVar6 * 0x10);
          sVar10 = TernaryLambdaWrapper::
                   Operation<duckdb::TrimPathFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,sVar10,b_00,
                              (bool)local_1a0.data[iVar7],in_stack_fffffffffffffde8,(idx_t)result);
          *(long *)(pdVar9 + -8) = sVar10.value._0_8_;
          *(long *)pdVar9 = sVar10.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&this_00->super_TemplatedValidityMask<unsigned_long>,iVar8);
        }
        pdVar9 = pdVar9 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_1a0);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  Vector::~Vector(&trim_extension);
  Vector::~Vector(&separator);
  return;
}

Assistant:

static void TrimPathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(Value::BOOLEAN(false));
	ReadOptionalArgs(args, separator, trim_extension, FRONT_TRIM);

	TernaryExecutor::Execute<string_t, string_t, bool, string_t>(
	    path, separator, trim_extension, result, args.size(),
	    [&](string_t &inputs, string_t input_sep, bool trim_extension) {
		    auto data = inputs.GetData();
		    auto input_size = inputs.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    // find the beginning idx and the size of the result string
		    idx_t begin = 0;
		    idx_t new_size = input_size;
		    if (FRONT_TRIM) { // left trim
			    auto pos = Find(data, input_size, sep);
			    if (pos == 0) { // path starts with separator
				    pos = 1;
			    }
			    new_size = (IsIdxValid(pos, input_size)) ? pos : 0;
		    } else { // right trim
			    auto idx_last_sep = FindLast(data, input_size, sep);
			    if (IsIdxValid(idx_last_sep, input_size)) {
				    begin = idx_last_sep + 1;
			    }
			    if (trim_extension) {
				    auto idx_extension_sep = FindLast(data, input_size, ".");
				    if (begin <= idx_extension_sep && IsIdxValid(idx_extension_sep, input_size)) {
					    new_size = idx_extension_sep;
				    }
			    }
		    }
		    // copy the trimmed string
		    D_ASSERT(begin <= new_size);
		    auto target = StringVector::EmptyString(result, new_size - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, new_size - begin);

		    target.Finalize();
		    return target;
	    });
}